

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RenameMemoryToRegister
               (ExpressionContext *ctx,VmModule *module,VmBlock *block,
               SmallArray<VmValue_*,_32U> *stack,VariableData *variable,
               ArrayView<VmInstruction_*> phiNodes)

{
  uint uVar1;
  FunctionData *pFVar2;
  TypeBase *type;
  VmBlock *pVVar3;
  char *pcVar4;
  bool bVar5;
  VmValueType VVar6;
  uint uVar7;
  VmValue **ppVVar8;
  VmInstruction *pVVar9;
  VmConstant *pVVar10;
  VariableData *variable_00;
  VmValue *pVVar11;
  ulong uVar12;
  TypeBase *structType;
  SynIdentifier *pSVar13;
  uint uVar14;
  int iVar15;
  VmInstruction *pVVar16;
  ulong uVar17;
  undefined8 in_R9;
  ulong uVar18;
  bool bVar19;
  VmType VVar20;
  VmType type_00;
  VmValue *in_stack_ffffffffffffff98;
  
  uVar7 = (uint)in_R9;
  uVar1 = stack->count;
  pVVar9 = block->firstInstruction;
  if (pVVar9 == (VmInstruction *)0x0) {
    if (block->prevSibling != (VmBlock *)0x0 || uVar1 != 0) goto LAB_001a0503;
LAB_001a0343:
    module->currentBlock = block;
    pVVar9 = block->insertPoint;
    while (((pVVar9 != (VmInstruction *)0x0 && (uVar14 = pVVar9->cmd - VM_INST_JUMP, uVar14 < 0x31))
           && ((0x1100000000037U >> ((ulong)uVar14 & 0x3f) & 1) != 0))) {
      pVVar9 = pVVar9->prevSibling;
      block->insertPoint = pVVar9;
    }
    pFVar2 = block->parent->function;
    for (structType = (TypeBase *)(pFVar2->argumentVariables).head; structType != (TypeBase *)0x0;
        structType = (TypeBase *)(structType->name).begin) {
      if (*(VariableData **)&structType->typeID == variable) goto LAB_001a03f0;
    }
    if (pFVar2->contextArgument == variable) {
LAB_001a03f0:
      type = variable->type;
      variable_00 = (VariableData *)ExpressionContext::GetReferenceType(ctx,type);
      pVVar11 = anon_unknown.dwarf_107107::CreateVariableAddress
                          (module,(SynBase *)variable,variable_00,structType);
      pVVar9 = (VmInstruction *)
               anon_unknown.dwarf_107107::CreateLoad(ctx,module,(SynBase *)0x0,type,pVVar11,uVar7);
      pSVar13 = variable->name;
    }
    else {
      VVar20 = GetVmType(ctx,variable->type);
      VVar6 = VVar20.type;
      if (VVar20._0_8_ >> 0x20 == 4 && VVar6 == VM_TYPE_INT) {
        pVVar10 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
      }
      else if (VVar20.size == 8 && VVar6 == VM_TYPE_DOUBLE) {
        pVVar10 = CreateConstantDouble(module->allocator,(SynBase *)0x0,0.0);
      }
      else {
        if ((VVar6 != VM_TYPE_POINTER) && (VVar6 != VM_TYPE_LONG || VVar20.size != 8)) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x173e,
                        "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                       );
        }
        pVVar10 = CreateConstantLong(module->allocator,(SynBase *)0x0,0);
      }
      VVar20.structType = (TypeBase *)0x7;
      VVar20._0_8_ = (pVVar10->super_VmValue).type.structType;
      pVVar9 = anon_unknown.dwarf_107107::CreateInstruction
                         ((anon_unknown_dwarf_107107 *)module,(VmModule *)0x0,
                          *(SynBase **)&(pVVar10->super_VmValue).type,VVar20,
                          (VmInstructionType)pVVar10,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                          (VmValue *)0x0,in_stack_ffffffffffffff98);
      pSVar13 = variable->name;
    }
    pcVar4 = (pSVar13->name).end;
    (pVVar9->super_VmValue).comment.begin = (pSVar13->name).begin;
    (pVVar9->super_VmValue).comment.end = pcVar4;
    pVVar16 = (VmInstruction *)0x0;
    if ((pVVar9->super_VmValue).typeID == 2) {
      pVVar16 = pVVar9;
    }
    if (stack->count == stack->max) {
      SmallArray<VmValue_*,_32U>::grow(stack,stack->count);
    }
    if (stack->data == (VmValue **)0x0) {
LAB_001a0701:
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<VmValue *, 32>::push_back(const T &) [T = VmValue *, N = 32]");
    }
    uVar7 = stack->count;
    stack->count = uVar7 + 1;
    stack->data[uVar7] = &pVVar16->super_VmValue;
  }
  else {
    bVar19 = false;
    do {
      bVar5 = IsMemoryLoadOfVariable(pVVar9,variable);
      if (bVar5) {
        (pVVar9->super_VmValue).canBeRemoved = false;
        uVar7 = stack->count;
        if (block->prevSibling == (VmBlock *)0x0) {
          if (uVar7 != 0) goto LAB_001a0116;
          if (stack->max == 0) {
            SmallArray<VmValue_*,_32U>::grow(stack,0);
          }
          if (stack->data == (VmValue **)0x0) goto LAB_001a0701;
          uVar7 = stack->count;
          stack->count = uVar7 + 1;
          stack->data[uVar7] = &pVVar9->super_VmValue;
        }
        else {
          if (uVar7 == 0) goto LAB_001a06a4;
LAB_001a0116:
          anon_unknown.dwarf_107107::ReplaceValueUsersWith
                    (module,&pVVar9->super_VmValue,stack->data[uVar7 - 1],(uint *)0x0);
        }
        (pVVar9->super_VmValue).canBeRemoved = true;
      }
      bVar5 = IsMemoryStoreToVariable(pVVar9,variable);
      if (bVar5) {
        if ((pVVar9->arguments).count < 3) {
LAB_001a0685:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        pVVar16 = (VmInstruction *)(pVVar9->arguments).data[2];
        if (pVVar16 == (VmInstruction *)0x0) {
LAB_001a06e2:
          __assert_fail("!\"unknown argument type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1718,
                        "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                       );
        }
        uVar7 = (pVVar16->super_VmValue).typeID;
        if (uVar7 != 1) {
          if (uVar7 != 2) goto LAB_001a06e2;
          pcVar4 = (variable->name->name).end;
          (pVVar16->super_VmValue).comment.begin = (variable->name->name).begin;
          (pVVar16->super_VmValue).comment.end = pcVar4;
        }
        if (stack->count == stack->max) {
          SmallArray<VmValue_*,_32U>::grow(stack,stack->count);
        }
        ppVVar8 = stack->data;
        bVar19 = true;
LAB_001a01fb:
        if (ppVVar8 == (VmValue **)0x0) goto LAB_001a0701;
        uVar7 = stack->count;
        stack->count = uVar7 + 1;
        ppVVar8[uVar7] = &pVVar16->super_VmValue;
      }
      else if (pVVar9->cmd == VM_INST_PHI && phiNodes.count != 0) {
        uVar18 = 0;
        do {
          if (phiNodes.data[uVar18] == pVVar9) {
            if (stack->count == stack->max) {
              SmallArray<VmValue_*,_32U>::grow(stack,stack->count);
            }
            ppVVar8 = stack->data;
            pVVar16 = pVVar9;
            goto LAB_001a01fb;
          }
          uVar18 = uVar18 + 1;
        } while (phiNodes.count != uVar18);
      }
      uVar7 = (uint)in_R9;
      pVVar9 = pVVar9->nextSibling;
    } while (pVVar9 != (VmInstruction *)0x0);
    uVar14 = stack->count;
    if (block->prevSibling == (VmBlock *)0x0 && uVar14 == 0) goto LAB_001a0343;
    if (!bVar19) goto LAB_001a0503;
    module->currentBlock = block;
    pVVar9 = block->lastInstruction;
    block->insertPoint = pVVar9->prevSibling;
    if (uVar14 == 0) {
LAB_001a06a4:
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,"T &SmallArray<VmValue *, 32>::back() [T = VmValue *, N = 32]");
    }
    pVVar11 = stack->data[uVar14 - 1];
    if ((pVVar11 != (VmValue *)0x0) && (pVVar11->typeID == 1)) {
      type_00.structType = (TypeBase *)0x7;
      type_00._0_8_ = (pVVar11->type).structType;
      pVVar9 = anon_unknown.dwarf_107107::CreateInstruction
                         ((anon_unknown_dwarf_107107 *)module,(VmModule *)pVVar11->source,
                          *(SynBase **)&pVVar11->type,type_00,(VmInstructionType)pVVar11,
                          (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                          in_stack_ffffffffffffff98);
      pcVar4 = (variable->name->name).end;
      (pVVar9->super_VmValue).comment.begin = (variable->name->name).begin;
      (pVVar9->super_VmValue).comment.end = pcVar4;
      if (stack->count == 0) goto LAB_001a06a4;
      stack->data[stack->count - 1] = &pVVar9->super_VmValue;
      pVVar9 = block->lastInstruction;
    }
    block->insertPoint = pVVar9;
  }
  module->currentBlock = (VmBlock *)0x0;
LAB_001a0503:
  uVar7 = (block->successors).count;
  if (uVar7 != 0) {
    uVar18 = 0;
    do {
      pVVar3 = (block->successors).data[uVar18];
      uVar12 = (ulong)(pVVar3->predecessors).count;
      if (uVar12 == 0) {
LAB_001a06c3:
        __assert_fail("j != ~0u",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1768,
                      "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                     );
      }
      uVar17 = 0;
      do {
        iVar15 = (int)uVar17;
        if ((pVVar3->predecessors).data[uVar17] != block) {
          iVar15 = -1;
        }
        uVar17 = uVar17 + 1;
      } while ((uVar17 < uVar12) && (iVar15 == -1));
      if (iVar15 == -1) goto LAB_001a06c3;
      pVVar9 = pVVar3->firstInstruction;
      if (pVVar9 != (VmInstruction *)0x0) {
        do {
          if (pVVar9->cmd != VM_INST_PHI) break;
          if ((ulong)phiNodes.count != 0) {
            uVar12 = 0;
            do {
              if (phiNodes.data[uVar12] == pVVar9) {
                if (stack->count == 0) goto LAB_001a06a4;
                if ((pVVar9->arguments).count <= (uint)(iVar15 * 2)) goto LAB_001a0685;
                uVar7 = stack->count - 1;
                (pVVar9->arguments).data[(uint)(iVar15 * 2)] = stack->data[uVar7];
                VmValue::AddUse(stack->data[uVar7],&pVVar9->super_VmValue);
                break;
              }
              uVar12 = uVar12 + 1;
            } while (phiNodes.count != uVar12);
          }
          pVVar9 = pVVar9->nextSibling;
        } while (pVVar9 != (VmInstruction *)0x0);
        uVar7 = (block->successors).count;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar7);
  }
  if ((block->dominanceChildren).count != 0) {
    uVar18 = 0;
    do {
      RenameMemoryToRegister
                (ctx,module,(block->dominanceChildren).data[uVar18],stack,variable,phiNodes);
      uVar18 = uVar18 + 1;
    } while (uVar18 < (block->dominanceChildren).count);
  }
  if (uVar1 <= stack->count) {
    stack->count = uVar1;
    return;
  }
  __assert_fail("newSize <= count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x1a8,"void SmallArray<VmValue *, 32>::shrink(unsigned int) [T = VmValue *, N = 32]"
               );
}

Assistant:

void RenameMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmBlock *block, SmallArray<VmValue*, 32> &stack, VariableData *variable, ArrayView<VmInstruction*> phiNodes)
{
	unsigned oldSize = stack.size();

	bool hadUpdate = false;

	for(VmInstruction *instruction = block->firstInstruction; instruction; instruction = instruction->nextSibling)
	{
		if(IsMemoryLoadOfVariable(instruction, variable))
		{
			// Do not reorder instruction stream, perform a separate dead instruction elimination pass later
			instruction->canBeRemoved = false;

			if(!block->prevSibling && stack.empty())
				stack.push_back(instruction);
			else
				ReplaceValueUsersWith(module, instruction, stack.back(), NULL);

			instruction->canBeRemoved = true;
		}

		if(IsMemoryStoreToVariable(instruction, variable))
		{
			if(VmInstruction *inst = getType<VmInstruction>(instruction->arguments[2]))
			{
				hadUpdate = true;

				inst->comment = variable->name->name;

				stack.push_back(getType<VmInstruction>(inst));
			}
			else if(VmConstant *constant = getType<VmConstant>(instruction->arguments[2]))
			{
				hadUpdate = true;

				stack.push_back(constant);
			}
			else
			{
				assert(!"unknown argument type");
			}
		}
		else if(IsPhiOfVariable(instruction, phiNodes))
		{
			stack.push_back(instruction);
		}
	}

	// If we have completed the entry block and there was no definition of the variable, create an argument load or a constant zero for a local
	if(!block->prevSibling && stack.empty())
	{
		module->currentBlock = block;

		while(block->insertPoint && IsBlockTerminator(block->insertPoint->cmd))
			block->insertPoint = block->insertPoint->prevSibling;

		if(IsArgumentVariable(block->parent->function, variable))
		{
			VmValue *loadInst = CreateLoad(ctx, module, NULL, variable->type, CreateVariableAddress(module, NULL, variable, ctx.GetReferenceType(variable->type)), 0);

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}
		else
		{
			VmValue *loadInst = NULL;

			VmType vmType = GetVmType(ctx, variable->type);

			if(vmType == VmType::Int || (NULLC_PTR_SIZE == 4 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantInt(module->allocator, NULL, 0));
			else if(vmType == VmType::Double)
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantDouble(module->allocator, NULL, 0));
			else if(vmType == VmType::Long || (NULLC_PTR_SIZE == 8 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantLong(module->allocator, NULL, 0));
			else
				assert(!"unknown type");

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}

		module->currentBlock = NULL;
	}
	else if(hadUpdate)
	{
		// Finalize last value before terminator instruction
		module->currentBlock = block;
		block->insertPoint = block->lastInstruction->prevSibling;

		if(VmConstant *constant = getType<VmConstant>(stack.back()))
		{
			// Create immediate load for final constant value
			VmValue *loadInst = CreateLoadImmediate(module, constant->source, constant);

			loadInst->comment = variable->name->name;

			stack.back() = loadInst;
		}

		block->insertPoint = block->lastInstruction;
		module->currentBlock = NULL;
	}

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		// Find which predecessor is the X for Y
		unsigned j = ~0u;

		for(unsigned k = 0; k < successor->predecessors.size() && j == ~0u; k++)
		{
			if(block == successor->predecessors[k])
				j = k;
		}

		assert(j != ~0u);

		// Find phi node for current variable
		for(VmInstruction *inst = successor->firstInstruction; inst; inst = inst->nextSibling)
		{
			// We won't find any phi instructions after the last one
			if(inst->cmd != VM_INST_PHI)
				break;

			if(IsPhiOfVariable(inst, phiNodes))
			{
				inst->arguments[j * 2] = stack.back();

				stack.back()->AddUse(inst);
			}
		}
	}

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
		RenameMemoryToRegister(ctx, module, block->dominanceChildren[i], stack, variable, phiNodes);

	stack.shrink(oldSize);
}